

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3
  ;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  double *pdVar5;
  ulong uVar6;
  value_type vVar7;
  
  pFVar3 = (fadexpr->fadexpr_).left_;
  uVar1 = (((((pFVar3->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  uVar2 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 <= (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar6 = (long)(int)uVar2 << 3;
      }
      pdVar5 = (double *)operator_new__(uVar6);
      (this->dx_).ptr_to_data = pdVar5;
    }
  }
  if (uVar2 != 0) {
    pdVar5 = (this->dx_).ptr_to_data;
    pFVar3 = (fadexpr->fadexpr_).left_;
    if ((((((((pFVar3->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts == 0) ||
        ((((pFVar3->fadexpr_).right_)->dx_).num_elts == 0)) ||
       ((((fadexpr->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        uVar6 = 0;
        do {
          vVar7 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
                  ::dx(&fadexpr->fadexpr_,(int)uVar6);
          pdVar5[uVar6] = vVar7;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
    }
    else if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        vVar7 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar6);
        pdVar5[uVar6] = vVar7;
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
  }
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  this->val_ = ((pFVar4->fadexpr_).left_.constant_ * ((pFVar4->fadexpr_).right_)->val_ *
               ((pFVar3->fadexpr_).right_)->val_) / ((fadexpr->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}